

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O3

void __thiscall
iDynTree::SpatialInertia::fromRotationalInertiaWrtCenterOfMass
          (SpatialInertia *this,double mass,Position *com,RotationalInertia *rotInertiaWrtCom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  long lVar5;
  ActualDstType actualDst;
  PointerType ptr;
  double dVar6;
  undefined1 auVar7 [16];
  Vector3d local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_28;
  
  this->m_mass = mass;
  lVar5 = 1;
  do {
    this->m_mcom[lVar5 + -1] = (com->super_Vector3).m_data[lVar5 + -1] * mass;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if (mass == 0.0) {
    dVar6 = (rotInertiaWrtCom->super_Matrix3x3).m_data[1];
    (this->m_rotInertia).super_Matrix3x3.m_data[0] = (rotInertiaWrtCom->super_Matrix3x3).m_data[0];
    (this->m_rotInertia).super_Matrix3x3.m_data[1] = dVar6;
    dVar6 = (rotInertiaWrtCom->super_Matrix3x3).m_data[3];
    (this->m_rotInertia).super_Matrix3x3.m_data[2] = (rotInertiaWrtCom->super_Matrix3x3).m_data[2];
    (this->m_rotInertia).super_Matrix3x3.m_data[3] = dVar6;
    dVar6 = (rotInertiaWrtCom->super_Matrix3x3).m_data[5];
    (this->m_rotInertia).super_Matrix3x3.m_data[4] = (rotInertiaWrtCom->super_Matrix3x3).m_data[4];
    (this->m_rotInertia).super_Matrix3x3.m_data[5] = dVar6;
    dVar6 = (rotInertiaWrtCom->super_Matrix3x3).m_data[7];
    (this->m_rotInertia).super_Matrix3x3.m_data[6] = (rotInertiaWrtCom->super_Matrix3x3).m_data[6];
    (this->m_rotInertia).super_Matrix3x3.m_data[7] = dVar6;
    dVar6 = (rotInertiaWrtCom->super_Matrix3x3).m_data[8];
  }
  else {
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = this->m_mcom[0];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = this->m_mcom[1];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = this->m_mcom[2];
    squareCrossProductMatrix(&local_88);
    dVar6 = this->m_mass;
    dVar4 = (rotInertiaWrtCom->super_Matrix3x3).m_data[1];
    auVar7._8_8_ = dVar6;
    auVar7._0_8_ = dVar6;
    auVar7 = divpd(local_68,auVar7);
    (this->m_rotInertia).super_Matrix3x3.m_data[0] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[0] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[1] = dVar4 - auVar7._8_8_;
    dVar4 = (rotInertiaWrtCom->super_Matrix3x3).m_data[3];
    auVar1._8_8_ = dVar6;
    auVar1._0_8_ = dVar6;
    auVar7 = divpd(local_58,auVar1);
    (this->m_rotInertia).super_Matrix3x3.m_data[2] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[2] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[3] = dVar4 - auVar7._8_8_;
    dVar4 = (rotInertiaWrtCom->super_Matrix3x3).m_data[5];
    auVar2._8_8_ = dVar6;
    auVar2._0_8_ = dVar6;
    auVar7 = divpd(local_48,auVar2);
    (this->m_rotInertia).super_Matrix3x3.m_data[4] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[4] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[5] = dVar4 - auVar7._8_8_;
    dVar4 = (rotInertiaWrtCom->super_Matrix3x3).m_data[7];
    auVar3._8_8_ = dVar6;
    auVar3._0_8_ = dVar6;
    auVar7 = divpd(local_38,auVar3);
    (this->m_rotInertia).super_Matrix3x3.m_data[6] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[6] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[7] = dVar4 - auVar7._8_8_;
    dVar6 = (rotInertiaWrtCom->super_Matrix3x3).m_data[8] - local_28 / dVar6;
  }
  (this->m_rotInertia).super_Matrix3x3.m_data[8] = dVar6;
  return;
}

Assistant:

void SpatialInertia::fromRotationalInertiaWrtCenterOfMass(const double mass,
                                                        const Position& com,
                                                        const RotationalInertia& rotInertiaWrtCom)
{
    this->m_mass = mass;

    for(int i = 0; i < 3; i++ )
    {
        this->m_mcom[i] = this->m_mass*com(i);
    }

    // Here we need to compute the rotational inertia at the com
    // given the one expressed at the frame origin
    // we apply formula 2.63 in Featherstone 2008
    Eigen::Map<Eigen::Matrix3d> linkInertia(this->m_rotInertia.data());
    Eigen::Map<const Eigen::Matrix3d> comInertia(rotInertiaWrtCom.data());
    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);

    if( fabs(this->m_mass) > 0)
    {
        linkInertia = comInertia - squareCrossProductMatrix(mcom)/this->m_mass;
    }
    else
    {
        linkInertia = comInertia;
    }
}